

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O3

GLFWmonitor * vera::getMonitorFromWindow(GLFWwindow *window)

{
  uint uVar1;
  int iVar2;
  GLFWmonitor **ppGVar3;
  GLFWvidmode *pGVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  GLFWmonitor *pGVar11;
  int iVar12;
  int monitorCount;
  _rect monitorRect;
  int local_6c;
  uint local_68;
  uint uStack_64;
  int iStack_60;
  int iStack_5c;
  undefined8 local_58;
  int iStack_50;
  uint auStack_4c [3];
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  
  local_58 = 0;
  iStack_50 = 0;
  auStack_4c[0] = 0;
  if (window == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/src/window.cpp"
                  ,0x81,"GLFWmonitor *vera::getMonitorFromWindow(GLFWwindow *)");
  }
  ppGVar3 = glfwGetMonitors(&local_6c);
  if (local_6c == 1) {
LAB_001f2e28:
    pGVar11 = *ppGVar3;
  }
  else {
    if (1 < local_6c) {
      glfwGetWindowPos(window,(int *)&local_68,(int *)&uStack_64);
      glfwGetWindowSize(window,&iStack_60,&iStack_5c);
      glfwGetWindowFrameSize
                (window,(int *)&local_58,(int *)((long)&local_58 + 4),&iStack_50,(int *)auStack_4c);
      iVar12 = (int)(local_58 >> 0x20);
      iStack_60 = iStack_50 + (int)local_58 + iStack_60;
      iStack_5c = auStack_4c[0] + iVar12 + iStack_5c;
      local_68 = local_68 - (int)local_58;
      uStack_64 = uStack_64 - iVar12;
      uVar10 = 0;
      if (local_6c < 1) {
        return (GLFWmonitor *)0x0;
      }
      uVar6 = 0xffffffff;
      uVar9 = 0;
      iVar12 = 0;
      do {
        glfwGetMonitorPos(ppGVar3[uVar9],(int *)&local_40,(int *)&local_3c);
        pGVar4 = glfwGetVideoMode(ppGVar3[uVar9]);
        local_38 = pGVar4->width;
        local_34 = pGVar4->height;
        iStack_50 = local_38 + local_40;
        if ((((iStack_50 < (int)local_68) || (iVar7 = iStack_60 + local_68, iVar7 < (int)local_40))
            || (iVar2 = local_34 + local_3c, iVar2 < (int)uStack_64)) ||
           (iVar8 = iStack_5c + uStack_64, iVar8 < (int)local_3c)) {
          iStack_50 = 0;
          auStack_4c[0] = 0;
          local_58 = 0;
          uVar5 = 0;
        }
        else {
          uVar5 = local_40;
          if ((int)local_40 < (int)local_68) {
            uVar5 = local_68;
          }
          if (iVar7 < iStack_50) {
            iStack_50 = iVar7;
          }
          iStack_50 = iStack_50 - uVar5;
          uVar1 = local_3c;
          if ((int)local_3c < (int)uStack_64) {
            uVar1 = uStack_64;
          }
          if (iVar8 < iVar2) {
            iVar2 = iVar8;
          }
          auStack_4c[0] = iVar2 - uVar1;
          local_58 = (ulong)uVar1 << 0x20;
        }
        local_58 = local_58 | uVar5;
        if (auStack_4c[0] * iStack_50 != 0 && uVar10 * iVar12 < auStack_4c[0] * iStack_50) {
          uVar6 = uVar9 & 0xffffffff;
          iVar12 = iStack_50;
          uVar10 = auStack_4c[0];
        }
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)local_6c);
      if (-1 < (int)uVar6) {
        ppGVar3 = ppGVar3 + uVar6;
        goto LAB_001f2e28;
      }
    }
    pGVar11 = (GLFWmonitor *)0x0;
  }
  return pGVar11;
}

Assistant:

GLFWAPI GLFWmonitor* getMonitorFromWindow(GLFWwindow* window) {  
    GLFWmonitor* result = NULL;

    int monitorCount;
    GLFWmonitor** monitors;
    const GLFWvidmode* vidmode;

    unsigned int currentDim, overlapDim;
    int overlapMonitor, i;

    _rect windowRect;
    _rect monitorRect;
    _rect scratchRect = { 0, 0, 0, 0 };
    _rect overlapRect = { 0, 0, 0, 0 };

    assert(window != NULL);

    // _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    monitors = glfwGetMonitors(&monitorCount);

    if (monitorCount == 1)
        result = monitors[0];

    else if (monitorCount > 1) {
        glfwGetWindowPos(window, &windowRect.x, &windowRect.y);
        glfwGetWindowSize(window, &windowRect.w, &windowRect.h);

        glfwGetWindowFrameSize(window, &scratchRect.x, &scratchRect.y, 
        &scratchRect.w, &scratchRect.h);

        windowRect.x -= scratchRect.x;
        windowRect.y -= scratchRect.y;
        windowRect.w += scratchRect.x + scratchRect.w;
        windowRect.h += scratchRect.y + scratchRect.h;

        overlapMonitor = -1;

        for (i = 0; i < monitorCount; i++) {
            glfwGetMonitorPos(monitors[i], &monitorRect.x, &monitorRect.y);

            vidmode = glfwGetVideoMode(monitors[i]);
            monitorRect.w = vidmode->width;
            monitorRect.h = vidmode->height;

            scratchRect = _get_intersection(&windowRect, &monitorRect);

            currentDim = scratchRect.w * scratchRect.h;
            overlapDim = overlapRect.w * overlapRect.h;

            if (currentDim > 0 && currentDim > overlapDim) {
                overlapRect = scratchRect;
                overlapMonitor = i;
            }
        }

        if (overlapMonitor >= 0)
        result = monitors[overlapMonitor];
    }

    return result;
}